

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track-heuristic.cxx
# Opt level: O2

Parameters * parseCommandLine(Parameters *__return_storage_ptr__,int argc,char **argv)

{
  unsigned_long val;
  ostream *poVar1;
  runtime_error *this;
  char *pcVar2;
  allocator<char> local_a2b;
  allocator<char> local_a2a;
  allocator<char> local_a29;
  double local_a28;
  allocator<char> local_a19;
  string local_a18;
  string local_9f8;
  int local_9d4;
  string local_9d0;
  char **local_9b0;
  SwitchArg argBifurcationConstraint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  ValueArg<unsigned_long> argMaxIter;
  ValueArg<double> argBirthCost;
  ValueArg<double> argTerminationCost;
  ValueArg<double> argBiasTemporal;
  ValueArg<double> argBiasSpatial;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argSolutionName;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argEdgesFileName;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argNodesFileName;
  CmdLine tclap;
  
  Parameters::Parameters(__return_storage_ptr__);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argNodesFileName,"track",(allocator<char> *)&argSolutionName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argEdgesFileName,"1.0",(allocator<char> *)&argBiasSpatial);
  TCLAP::CmdLine::CmdLine(&tclap,(string *)&argNodesFileName,' ',(string *)&argEdgesFileName,true);
  std::__cxx11::string::~string((string *)&argEdgesFileName);
  std::__cxx11::string::~string((string *)&argNodesFileName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argEdgesFileName,"n",(allocator<char> *)&argTerminationCost);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argSolutionName,"nodes-file",(allocator<char> *)&argBirthCost);
  local_9d4 = argc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBiasSpatial,"nodes information",(allocator<char> *)&argMaxIter);
  std::__cxx11::string::string
            ((string *)&local_8c0,(string *)&__return_storage_ptr__->nodesFileName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBiasTemporal,"nodes-file",(allocator<char> *)&argBifurcationConstraint);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&argNodesFileName,(string *)&argEdgesFileName,(string *)&argSolutionName,
             (string *)&argBiasSpatial,true,&local_8c0,(string *)&argBiasTemporal,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&argBiasTemporal);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&argBiasSpatial);
  std::__cxx11::string::~string((string *)&argSolutionName);
  std::__cxx11::string::~string((string *)&argEdgesFileName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argSolutionName,"e",(allocator<char> *)&argBirthCost);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBiasSpatial,"edges-file",(allocator<char> *)&argMaxIter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBiasTemporal,"edges information",
             (allocator<char> *)&argBifurcationConstraint);
  std::__cxx11::string::string((string *)&local_8e0,(string *)__return_storage_ptr__);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argTerminationCost,"edges-file",(allocator<char> *)&local_a18);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&argEdgesFileName,(string *)&argSolutionName,(string *)&argBiasSpatial,
             (string *)&argBiasTemporal,true,&local_8e0,(string *)&argTerminationCost,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&argTerminationCost);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&argBiasTemporal);
  std::__cxx11::string::~string((string *)&argBiasSpatial);
  std::__cxx11::string::~string((string *)&argSolutionName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBiasSpatial,"s",(allocator<char> *)&argMaxIter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBiasTemporal,"solution-name",(allocator<char> *)&argBifurcationConstraint
            );
  local_9b0 = argv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argTerminationCost,"solution name",(allocator<char> *)&local_a18);
  std::__cxx11::string::string((string *)&local_900,(string *)&__return_storage_ptr__->solutionName)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBirthCost,"solution-name",(allocator<char> *)&local_9f8);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(&argSolutionName,(string *)&argBiasSpatial,(string *)&argBiasTemporal,
             (string *)&argTerminationCost,true,&local_900,(string *)&argBirthCost,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&argBirthCost);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&argTerminationCost);
  std::__cxx11::string::~string((string *)&argBiasTemporal);
  std::__cxx11::string::~string((string *)&argBiasSpatial);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBiasTemporal,"b",(allocator<char> *)&argBifurcationConstraint);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argTerminationCost,"cut-prior-spatial",(allocator<char> *)&local_a18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBirthCost,"cut prior spatial",(allocator<char> *)&local_9f8);
  local_a28 = __return_storage_ptr__->biasSpatial;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argMaxIter,"cut prior spatial",(allocator<char> *)&local_9d0);
  TCLAP::ValueArg<double>::ValueArg
            (&argBiasSpatial,(string *)&argBiasTemporal,(string *)&argTerminationCost,
             (string *)&argBirthCost,false,local_a28,(string *)&argMaxIter,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&argMaxIter);
  std::__cxx11::string::~string((string *)&argBirthCost);
  std::__cxx11::string::~string((string *)&argTerminationCost);
  std::__cxx11::string::~string((string *)&argBiasTemporal);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argTerminationCost,"t",(allocator<char> *)&local_a18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBirthCost,"cut-prior-temporal",(allocator<char> *)&local_9f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argMaxIter,"cut prior temporal",(allocator<char> *)&local_9d0);
  local_a28 = __return_storage_ptr__->biasTemporal;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBifurcationConstraint,"cut prior temporal",&local_a2b);
  TCLAP::ValueArg<double>::ValueArg
            (&argBiasTemporal,(string *)&argTerminationCost,(string *)&argBirthCost,
             (string *)&argMaxIter,false,local_a28,(string *)&argBifurcationConstraint,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&argBifurcationConstraint);
  std::__cxx11::string::~string((string *)&argMaxIter);
  std::__cxx11::string::~string((string *)&argBirthCost);
  std::__cxx11::string::~string((string *)&argTerminationCost);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBirthCost,"T",(allocator<char> *)&local_9f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argMaxIter,"termination-cost",(allocator<char> *)&local_9d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBifurcationConstraint,"early termination cost",&local_a2b);
  local_a28 = __return_storage_ptr__->terminationCost;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a18,"early termination cost",&local_a2a);
  TCLAP::ValueArg<double>::ValueArg
            (&argTerminationCost,(string *)&argBirthCost,(string *)&argMaxIter,
             (string *)&argBifurcationConstraint,false,local_a28,&local_a18,
             &tclap.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&argBifurcationConstraint);
  std::__cxx11::string::~string((string *)&argMaxIter);
  std::__cxx11::string::~string((string *)&argBirthCost);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argMaxIter,"B",(allocator<char> *)&local_9d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBifurcationConstraint,"birth-cost",&local_a2b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,"birth cost",&local_a2a);
  local_a28 = __return_storage_ptr__->birthCost;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f8,"birth cost",&local_a29);
  TCLAP::ValueArg<double>::ValueArg
            (&argBirthCost,(string *)&argMaxIter,(string *)&argBifurcationConstraint,&local_a18,
             false,local_a28,&local_9f8,&tclap.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&argBifurcationConstraint);
  std::__cxx11::string::~string((string *)&argMaxIter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argBifurcationConstraint,"I",&local_a2b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,"max-iter",&local_a2a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f8,"maximum iterations",&local_a29);
  val = __return_storage_ptr__->maxIter;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9d0,"max iter",&local_a19);
  TCLAP::ValueArg<unsigned_long>::ValueArg
            (&argMaxIter,(string *)&argBifurcationConstraint,&local_a18,&local_9f8,false,val,
             &local_9d0,&tclap.super_CmdLineInterface,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::__cxx11::string::~string((string *)&local_a18);
  std::__cxx11::string::~string((string *)&argBifurcationConstraint);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,"F",&local_a2b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f8,"bifurcation-constraint",&local_a2a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9d0,"Enforce bifurcation contraint. (Default: disabled).",&local_a29);
  TCLAP::SwitchArg::SwitchArg
            (&argBifurcationConstraint,&local_a18,&local_9f8,&local_9d0,
             &tclap.super_CmdLineInterface,false,(Visitor *)0x0);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::__cxx11::string::~string((string *)&local_a18);
  TCLAP::CmdLine::parse(&tclap,local_9d4,local_9b0);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->nodesFileName);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->solutionName);
  __return_storage_ptr__->biasSpatial = argBiasSpatial._value;
  __return_storage_ptr__->biasTemporal = argBiasTemporal._value;
  __return_storage_ptr__->terminationCost = argTerminationCost._value;
  __return_storage_ptr__->birthCost = argBirthCost._value;
  __return_storage_ptr__->maxIter = argMaxIter._value;
  __return_storage_ptr__->bifurcationConstraint = (bool)argBifurcationConstraint.super_Arg._163_1_;
  if ((argBiasSpatial._value < 2.220446049250313e-16) ||
     (0.9999999999999998 < argBiasSpatial._value)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Spatial bias must be in the range (0, 1)");
  }
  else {
    if ((2.220446049250313e-16 <= argBiasTemporal._value) &&
       (argBiasTemporal._value <= 0.9999999999999998)) {
      poVar1 = std::operator<<((ostream *)&std::cout,"parameters:");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<(poVar1,"- cut prior (spatial) : ");
      poVar1 = std::ostream::_M_insert<double>(__return_storage_ptr__->biasSpatial);
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<(poVar1,"- cut prior (temporal): ");
      poVar1 = std::ostream::_M_insert<double>(__return_storage_ptr__->biasTemporal);
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<(poVar1,"- cost of termination : ");
      poVar1 = std::ostream::_M_insert<double>(__return_storage_ptr__->terminationCost);
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<(poVar1,"- cost of birth: ");
      poVar1 = std::ostream::_M_insert<double>(__return_storage_ptr__->birthCost);
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<(poVar1,"- bifurcation constraint: ");
      pcVar2 = "no";
      if (__return_storage_ptr__->bifurcationConstraint != false) {
        pcVar2 = "yes";
      }
      poVar1 = std::operator<<(poVar1,pcVar2);
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      TCLAP::Arg::~Arg(&argBifurcationConstraint.super_Arg);
      TCLAP::ValueArg<unsigned_long>::~ValueArg(&argMaxIter);
      TCLAP::ValueArg<double>::~ValueArg(&argBirthCost);
      TCLAP::ValueArg<double>::~ValueArg(&argTerminationCost);
      TCLAP::ValueArg<double>::~ValueArg(&argBiasTemporal);
      TCLAP::ValueArg<double>::~ValueArg(&argBiasSpatial);
      TCLAP::
      ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~ValueArg(&argSolutionName);
      TCLAP::
      ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~ValueArg(&argEdgesFileName);
      TCLAP::
      ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~ValueArg(&argNodesFileName);
      TCLAP::CmdLine::~CmdLine(&tclap);
      return __return_storage_ptr__;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Temporal bias must be in the range (0, 1)");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Parameters
parseCommandLine(int argc, char** argv) try {
    Parameters parameters;

    TCLAP::CmdLine tclap("track", ' ', "1.0");
    TCLAP::ValueArg<std::string> argNodesFileName(
        "n", "nodes-file", "nodes information", true, parameters.nodesFileName,
        "nodes-file", tclap);
    TCLAP::ValueArg<std::string> argEdgesFileName(
        "e", "edges-file", "edges information", true, parameters.edgesFileName,
        "edges-file", tclap);
    TCLAP::ValueArg<std::string> argSolutionName(
        "s", "solution-name", "solution name", true, parameters.solutionName,
        "solution-name", tclap);
    TCLAP::ValueArg<double> argBiasSpatial(
        "b", "cut-prior-spatial", "cut prior spatial", false,
        parameters.biasSpatial, "cut prior spatial", tclap);
    TCLAP::ValueArg<double> argBiasTemporal(
        "t", "cut-prior-temporal", "cut prior temporal", false,
        parameters.biasTemporal, "cut prior temporal", tclap);
    TCLAP::ValueArg<double> argTerminationCost(
        "T", "termination-cost", "early termination cost", false,
        parameters.terminationCost, "early termination cost", tclap);
    TCLAP::ValueArg<double> argBirthCost("B", "birth-cost", "birth cost", false,
                                         parameters.birthCost, "birth cost",
                                         tclap);
    TCLAP::ValueArg<size_t> argMaxIter("I", "max-iter", "maximum iterations",
                                       false, parameters.maxIter, "max iter",
                                       tclap);
    TCLAP::SwitchArg argBifurcationConstraint(
        "F", "bifurcation-constraint",
        "Enforce bifurcation contraint. (Default: disabled).", tclap);

    tclap.parse(argc, argv);

    parameters.edgesFileName = argEdgesFileName.getValue();
    parameters.nodesFileName = argNodesFileName.getValue();
    parameters.solutionName = argSolutionName.getValue();
    parameters.biasSpatial = argBiasSpatial.getValue();
    parameters.biasTemporal = argBiasTemporal.getValue();
    parameters.terminationCost = argTerminationCost.getValue();
    parameters.birthCost = argBirthCost.getValue();
    parameters.maxIter = argMaxIter.getValue();
    parameters.bifurcationConstraint = argBifurcationConstraint.getValue();

    if (parameters.biasSpatial < std::numeric_limits<double>::epsilon() ||
        parameters.biasSpatial > 1.0 - std::numeric_limits<double>::epsilon())
        throw std::runtime_error("Spatial bias must be in the range (0, 1)");

    if (parameters.biasTemporal < std::numeric_limits<double>::epsilon() ||
        parameters.biasTemporal > 1.0 - std::numeric_limits<double>::epsilon())
        throw std::runtime_error("Temporal bias must be in the range (0, 1)");

    std::cout << "parameters:" << std::endl
              << "- cut prior (spatial) : " << parameters.biasSpatial
              << std::endl
              << "- cut prior (temporal): " << parameters.biasTemporal
              << std::endl
              << "- cost of termination : " << parameters.terminationCost
              << std::endl
              << "- cost of birth: " << parameters.birthCost << std::endl
              << "- bifurcation constraint: "
              << (parameters.bifurcationConstraint ? "yes" : "no") << std::endl
              << std::endl;

    return parameters;
} catch (TCLAP::ArgException& e) {
    throw std::runtime_error(e.error());
}